

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O2

int YP_md_get_parameter_array(YPSpur *spur,int param_id,double *value)

{
  int iVar1;
  YPSpur_msg msg;
  
  msg.msg_type = 1;
  msg.pid = (long)spur->pid;
  msg.type = 0x101;
  msg.cs = param_id;
  iVar1 = (*(spur->dev).send)(&spur->dev,&msg);
  if ((-1 < iVar1) && (iVar1 = (*(spur->dev).recv)(&spur->dev,&msg), -1 < iVar1)) {
    *value = msg.data[0];
    value[1] = msg.data[1];
    return msg.cs;
  }
  spur->connection_error = 1;
  return -1;
}

Assistant:

int YP_md_get_parameter_array(YPSpur* spur, int param_id, double* value)
{
  YPSpur_msg msg;
  int len;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_PARAM_GET;
  msg.cs = param_id;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  /* 指定のコマンド受け取り */
  len = spur->dev.recv(&spur->dev, &msg);
  if (len < 0)
  {
    /* receive error */
    spur->connection_error = 1;
    return -1;
  }

  value[0] = msg.data[0];
  value[1] = msg.data[1];
  return msg.cs;
}